

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml,string *baseDir)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *this_00;
  reference b;
  const_reference ppcVar2;
  string *psVar3;
  string local_100;
  undefined1 local_e0 [8];
  string linkName;
  string linkSourceDirectory;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *__range1;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *baseDir_local;
  cmXMLWriter *xml_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  if ((this->GenerateLinkedResources & 1U) != 0) {
    local_20 = baseDir;
    baseDir_local = (string *)xml;
    xml_local = (cmXMLWriter *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"[Subprojects]",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"virtual:/virtual",(allocator<char> *)((long)&__range1 + 7));
    AppendLinkedResource(xml,&local_40,&local_78,VirtualFolder);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_00 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
             ::begin(this_00);
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
            ::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&it), bVar1) {
      b = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
          ::operator*(&__end1);
      ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&b->second,0);
      psVar3 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(*ppcVar2);
      GetEclipsePath((string *)((long)&linkName.field_2 + 8),psVar3);
      bVar1 = std::operator!=(local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&linkName.field_2 + 8));
      if ((bVar1) &&
         (bVar1 = cmsys::SystemTools::IsSubDirectory
                            (local_20,(string *)((long)&linkName.field_2 + 8)), !bVar1)) {
        cmStrCat<char_const(&)[15],std::__cxx11::string_const&>
                  ((string *)local_e0,(char (*) [15])"[Subprojects]/",&b->first);
        psVar3 = baseDir_local;
        GetEclipsePath(&local_100,(string *)((long)&linkName.field_2 + 8));
        AppendLinkedResource((cmXMLWriter *)psVar3,(string *)local_e0,&local_100,LinkToFolder);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)local_e0);
      }
      std::__cxx11::string::~string((string *)(linkName.field_2._M_local_buf + 8));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
  cmXMLWriter& xml, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources) {
    return;
  }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, "[Subprojects]", "virtual:/virtual", VirtualFolder);

  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        it.second[0]->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir, linkSourceDirectory)) {
      std::string linkName = cmStrCat("[Subprojects]/", it.first);
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, linkName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
    }
  }
}